

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_iterate64(container_t *c,uint8_t type,uint32_t base,roaring_iterator64 iterator,
                         uint64_t high_bits,void *ptr)

{
  _Bool _Var1;
  container_t *high_bits_00;
  uint64_t in_RCX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  container_t *in_RDI;
  roaring_iterator64 in_R8;
  uint64_t in_R9;
  uint32_t unaff_retaddr;
  undefined4 in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar2;
  uint8_t uVar3;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  high_bits_00 = container_unwrap_shared(in_RDI,&stack0xffffffffffffffef);
  uVar3 = (uint8_t)((uint)uVar2 >> 0x18);
  if (uVar3 == '\x01') {
    _Var1 = bitset_container_iterate64
                      ((bitset_container_t *)ptr,unaff_retaddr,
                       (roaring_iterator64)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint64_t)high_bits_00,(void *)CONCAT44(uVar2,in_EDX));
  }
  else if (uVar3 == '\x02') {
    _Var1 = array_container_iterate64
                      ((array_container_t *)CONCAT44(uVar2,in_EDX),(uint32_t)(in_RCX >> 0x20),in_R8,
                       in_R9,(void *)(ulong)CONCAT14(2,in_stack_ffffffffffffffc8));
  }
  else {
    _Var1 = run_container_iterate64
                      ((run_container_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint32_t)((ulong)high_bits_00 >> 0x20),
                       (roaring_iterator64)CONCAT44(uVar2,in_EDX),in_RCX,in_R8);
  }
  return _Var1;
}

Assistant:

static inline bool container_iterate64(const container_t *c, uint8_t type,
                                       uint32_t base,
                                       roaring_iterator64 iterator,
                                       uint64_t high_bits, void *ptr) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_iterate64(const_CAST_bitset(c), base,
                                              iterator, high_bits, ptr);
        case ARRAY_CONTAINER_TYPE:
            return array_container_iterate64(const_CAST_array(c), base,
                                             iterator, high_bits, ptr);
        case RUN_CONTAINER_TYPE:
            return run_container_iterate64(const_CAST_run(c), base, iterator,
                                           high_bits, ptr);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}